

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

void utf8fromcodepoint(PHYSFS_uint32 cp,char **_dst,PHYSFS_uint64 *_len)

{
  ulong uVar1;
  PHYSFS_uint64 PVar2;
  byte *pbVar3;
  byte bVar4;
  
  uVar1 = *_len;
  if (uVar1 == 0) {
    return;
  }
  pbVar3 = (byte *)*_dst;
  bVar4 = 0x3f;
  if ((cp & 0x1ffffe) != 0xfffe && cp < 0x110000) {
    if ((int)cp < 0xdbff) {
      if ((1 < cp - 0xdb7f) && (cp != 0xd800)) goto LAB_0010b40b;
    }
    else if ((1 < cp - 0xdbff) && ((cp != 0xdf80 && (cp != 0xdfff)))) {
LAB_0010b40b:
      bVar4 = (byte)cp;
      if (0x7f < cp) {
        if (cp < 0x800) {
          if (uVar1 != 1) {
            *pbVar3 = (byte)(cp >> 6) | 0xc0;
            pbVar3[1] = bVar4 & 0x3f | 0x80;
            pbVar3 = pbVar3 + 2;
            PVar2 = uVar1 - 2;
            goto LAB_0010b3c8;
          }
        }
        else if (cp < 0x10000) {
          if (2 < uVar1) {
            *pbVar3 = (byte)(cp >> 0xc) | 0xe0;
            pbVar3[1] = (byte)(cp >> 6) & 0x3f | 0x80;
            pbVar3[2] = bVar4 & 0x3f | 0x80;
            pbVar3 = pbVar3 + 3;
            PVar2 = uVar1 - 3;
            goto LAB_0010b3c8;
          }
        }
        else if (3 < uVar1) {
          *pbVar3 = (byte)(cp >> 0x12) | 0xf0;
          pbVar3[1] = (byte)(cp >> 0xc) & 0x3f | 0x80;
          pbVar3[2] = (byte)(cp >> 6) & 0x3f | 0x80;
          pbVar3[3] = bVar4 & 0x3f | 0x80;
          pbVar3 = pbVar3 + 4;
          PVar2 = uVar1 - 4;
          goto LAB_0010b3c8;
        }
        PVar2 = 0;
        goto LAB_0010b3c8;
      }
    }
  }
  *pbVar3 = bVar4;
  pbVar3 = pbVar3 + 1;
  PVar2 = uVar1 - 1;
LAB_0010b3c8:
  *_dst = (char *)pbVar3;
  *_len = PVar2;
  return;
}

Assistant:

static void utf8fromcodepoint(PHYSFS_uint32 cp, char **_dst, PHYSFS_uint64 *_len)
{
    char *dst = *_dst;
    PHYSFS_uint64 len = *_len;

    if (len == 0)
        return;

    if (cp > 0x10FFFF)
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else if ((cp == 0xFFFE) || (cp == 0xFFFF))  /* illegal values. */
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else
    {
        /* There are seven "UTF-16 surrogates" that are illegal in UTF-8. */
        switch (cp)
        {
            case 0xD800:
            case 0xDB7F:
            case 0xDB80:
            case 0xDBFF:
            case 0xDC00:
            case 0xDF80:
            case 0xDFFF:
                cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        } /* switch */
    } /* else */

    /* Do the encoding... */
    if (cp < 0x80)
    {
        *(dst++) = (char) cp;
        len--;
    } /* if */

    else if (cp < 0x800)
    {
        if (len < 2)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 6) | 128 | 64);
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 2;
        } /* else */
    } /* else if */

    else if (cp < 0x10000)
    {
        if (len < 3)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 12) | 128 | 64 | 32);
            *(dst++) = (char) ((cp >> 6) & 0x3F) | 128;
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 3;
        } /* else */
    } /* else if */

    else
    {
        if (len < 4)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 18) | 128 | 64 | 32 | 16);
            *(dst++) = (char) ((cp >> 12) & 0x3F) | 128;
            *(dst++) = (char) ((cp >> 6) & 0x3F) | 128;
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 4;
        } /* else if */
    } /* else */

    *_dst = dst;
    *_len = len;
}